

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall PDA::isEndState(PDA *this,State *state)

{
  pointer ppSVar1;
  pointer ppSVar2;
  __type _Var3;
  pointer ppSVar4;
  
  ppSVar1 = (this->endStatesF).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar2 = (this->endStatesF).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppSVar4 = ppSVar2;
    if (ppSVar4 == ppSVar1) break;
    _Var3 = std::operator==(&(*ppSVar4)->name,&state->name);
    ppSVar2 = ppSVar4 + 1;
  } while (!_Var3);
  return ppSVar4 != ppSVar1;
}

Assistant:

bool PDA::isEndState(State *state) {
    for (State *endState: endStatesF) {
        if (endState->getName() == state->getName()) {
            return true;
        }
    }
    return false;
}